

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

string * __thiscall
Edge::EvaluateCommand_abi_cxx11_(string *__return_storage_ptr__,Edge *this,bool incl_rsp_file)

{
  string rspfile_content;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"command",(allocator<char> *)&local_58);
  GetBinding(__return_storage_ptr__,this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (incl_rsp_file) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"rspfile_content",&local_59);
    GetBinding(&local_38,this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (local_38._M_string_length != 0) {
      std::operator+(&local_58,";rspfile=",&local_38);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Edge::EvaluateCommand(const bool incl_rsp_file) const {
  string command = GetBinding("command");
  if (incl_rsp_file) {
    string rspfile_content = GetBinding("rspfile_content");
    if (!rspfile_content.empty())
      command += ";rspfile=" + rspfile_content;
  }
  return command;
}